

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestForeign(void)

{
  bool bVar1;
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *f;
  size_t line_num;
  OutputBuffer buf;
  OutputBuffer copy;
  string world;
  string there;
  string hello;
  lazy_ostream *in_stack_fffffffffffffd78;
  char *pcVar2;
  basic_cstring<const_char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  begin *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  InputBuffer *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  const_string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  type_conflict3 tVar3;
  string *this;
  begin *in_stack_fffffffffffffde8;
  unit_test_log_t *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1;
  allocator<char> *f_00;
  undefined1 local_1d4 [28];
  undefined1 local_1b8 [56];
  basic_cstring<const_char> local_180 [2];
  string local_160 [128];
  InputBuffer *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d1;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            (in_stack_fffffffffffffd90,(const_string *)in_stack_fffffffffffffd88,
             (size_t)in_stack_fffffffffffffd80);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_fffffffffffffd88,
             (log_level)((ulong)in_stack_fffffffffffffd80 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffffd88,(char (*) [12])in_stack_fffffffffffffd80);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> *)
             0x23d2d4);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::allocator<char>::~allocator(&local_81);
  f_00 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::allocator<char>::~allocator(&local_a9);
  a1 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  tVar3 = (type_conflict3)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffda0,
             CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffda0,
             CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffd80,(data_type *)in_stack_fffffffffffffd78,
             0x23d3f7);
  this = local_a8;
  f = (bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::__cxx11::string::string(local_160,this);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            ((_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             f_00,a1);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void_()> *)this,f,tVar3);
  avro::OutputBuffer::appendForeignData
            ((OutputBuffer *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (size_type)in_stack_fffffffffffffd80,(free_func *)in_stack_fffffffffffffd78);
  boost::function<void_()>::~function((function<void_()> *)0x23d498);
  boost::_bi::
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~bind_t((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x23d4a5);
  std::__cxx11::string::~string(local_160);
  msg = (const_string *)&local_d1.field_0x1;
  line_num = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffd80,(data_type *)in_stack_fffffffffffffd78,
             0x23d4e8);
  avro::InputBuffer::InputBuffer
            (in_stack_fffffffffffffda0,
             (OutputBuffer *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  printBuffer(in_stack_ffffffffffffff20);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23d51d);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd80);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)f,line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd88,(char (*) [1])in_stack_fffffffffffffd80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1d4 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1d4._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x23d5c3);
    local_1d4._0_4_ = 0x12;
    in_stack_fffffffffffffd88 = "18U";
    in_stack_fffffffffffffd80 = (basic_cstring<const_char> *)local_1d4;
    pcVar2 = "buf.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1b8,local_1d4 + 0xc,0x420,1,2,local_1d4 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23d642);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::operator=((OutputBuffer *)in_stack_fffffffffffffd80,(OutputBuffer *)pcVar2);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23d67f);
  std::operator<<((ostream *)&std::cout,"Leaving inner scope\n");
  safeToDelete = true;
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23d6ab);
  std::__cxx11::string::~string((string *)&local_d1.field_0x1);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  std::operator<<((ostream *)&std::cout,"Leaving outer scope\n");
  safeToDelete = false;
  return;
}

Assistant:

void TestForeign ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer copy;

        {
            OutputBuffer buf;
            buf.writeTo(hello.c_str(), hello.size());
            buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
            buf.writeTo(world.c_str(), world.size());
        
            printBuffer(buf);
            BOOST_CHECK_EQUAL(buf.size(), 18U);
            copy = buf;
        }
        std::cout << "Leaving inner scope\n";
        safeToDelete = true;
    }
    std::cout << "Leaving outer scope\n";
    safeToDelete = false;
}